

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int validop(int op,TValue *v1,TValue *v2)

{
  int iVar1;
  double local_38;
  bool local_2d;
  lua_Integer local_28;
  lua_Integer i;
  TValue *v2_local;
  TValue *v1_local;
  int op_local;
  
  if ((op == 3) || (op - 5U < 2)) {
    if (v2->tt_ == '\x03') {
      local_38 = (double)(v2->value_).i;
    }
    else {
      local_38 = (v2->value_).n;
    }
    v1_local._4_4_ = (uint)(local_38 != 0.0);
  }
  else if ((op - 7U < 5) || (op == 0xd)) {
    i = (lua_Integer)v2;
    v2_local = v1;
    v1_local._0_4_ = op;
    iVar1 = luaV_tointegerns(v1,&local_28,F2Ieq);
    local_2d = false;
    if (iVar1 != 0) {
      iVar1 = luaV_tointegerns((TValue *)i,&local_28,F2Ieq);
      local_2d = iVar1 != 0;
    }
    v1_local._4_4_ = (uint)local_2d;
  }
  else {
    v1_local._4_4_ = 1;
  }
  return v1_local._4_4_;
}

Assistant:

static int validop (int op, TValue *v1, TValue *v2) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR: case LUA_OPBNOT: {  /* conversion errors */
      lua_Integer i;
      return (luaV_tointegerns(v1, &i, LUA_FLOORN2I) &&
              luaV_tointegerns(v2, &i, LUA_FLOORN2I));
    }
    case LUA_OPDIV: case LUA_OPIDIV: case LUA_OPMOD:  /* division by 0 */
      return (nvalue(v2) != 0);
    default: return 1;  /* everything else is valid */
  }
}